

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raplcap-msr.c
# Opt level: O3

int raplcap_pd_set_limits
              (raplcap *rc,uint32_t pkg,uint32_t die,raplcap_zone zone,raplcap_limit *limit_long,
              raplcap_limit *limit_short)

{
  long msr;
  int iVar1;
  int iVar2;
  raplcap_msr *ctx;
  int *piVar3;
  uint64_t msrval;
  uint64_t local_48;
  raplcap_limit *local_40;
  raplcap_limit *local_38;
  
  ctx = get_state(rc,pkg,die);
  if (zone < (RAPLCAP_ZONE_PSYS|RAPLCAP_ZONE_CORE)) {
    msr = ZONE_OFFSETS_PL[zone];
    iVar2 = -1;
    if (-1 < msr && ctx != (raplcap_msr *)0x0) {
      local_40 = limit_long;
      local_38 = limit_short;
      iVar1 = msr_sys_read(ctx->sys,&local_48,pkg,die,msr);
      if (iVar1 == 0) {
        local_48 = msr_set_limits(&ctx->ctx,zone,local_48,local_40,local_38);
        iVar2 = msr_sys_write(ctx->sys,local_48,pkg,die,msr);
      }
    }
  }
  else {
    piVar3 = __errno_location();
    *piVar3 = 0x16;
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

int raplcap_pd_set_limits(const raplcap* rc, uint32_t pkg, uint32_t die, raplcap_zone zone,
                          const raplcap_limit* limit_long, const raplcap_limit* limit_short) {
  uint64_t msrval;
  const raplcap_msr* state = get_state(rc, pkg, die);
  const off_t msr = zone_to_msr_offset(zone, ZONE_OFFSETS_PL);
  raplcap_log(DEBUG, "raplcap_pd_set_limits: pkg=%"PRIu32", die=%"PRIu32", zone=%d\n", pkg, die, zone);
  if (state == NULL || msr < 0 || msr_sys_read(state->sys, &msrval, pkg, die, msr)) {
    return -1;
  }
  msrval = msr_set_limits(&state->ctx, zone, msrval, limit_long, limit_short);
  return msr_sys_write(state->sys, msrval, pkg, die, msr);
}